

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

int Dau_DecVerify(word *pInit,int nVars,char *pDsdC,char *pDsdD)

{
  int iVar1;
  word *pwVar2;
  word wStack_30040;
  word pC1;
  word pC0;
  int nWordsD;
  int nWordsC;
  word pRes [8192];
  word pD [8192];
  word pC [8192];
  char *pDsdD_local;
  char *pDsdC_local;
  int nVars_local;
  word *pInit_local;
  
  pC0._4_4_ = Abc_TtWordNum(nVars + 1);
  pC0._0_4_ = Abc_TtWordNum(nVars);
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x2b4,"int Dau_DecVerify(word *, int, char *, char *)");
  }
  pwVar2 = Dau_DsdToTruth(pDsdC,nVars + 1);
  memcpy(pD + 0x1fff,pwVar2,(long)pC0._4_4_ << 3);
  pwVar2 = Dau_DsdToTruth(pDsdD,nVars);
  memcpy(pRes + 0x1fff,pwVar2,(long)(int)pC0 << 3);
  if (nVars < 6) {
    pC1 = Abc_Tt6Stretch(pD[0x1fff],nVars);
    wStack_30040 = Abc_Tt6Stretch(pD[0x1fff] >> ((byte)(1 << ((byte)nVars & 0x1f)) & 0x3f),nVars);
    Abc_TtMux((word *)&nWordsD,pRes + 0x1fff,&wStack_30040,&pC1,(int)pC0);
  }
  else {
    if ((int)pC0 < 1) {
      __assert_fail("nWordsD >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                    ,0x2b9,"int Dau_DecVerify(word *, int, char *, char *)");
    }
    if (pC0._4_4_ < 2) {
      __assert_fail("nWordsC > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                    ,0x2ba,"int Dau_DecVerify(word *, int, char *, char *)");
    }
    Abc_TtMux((word *)&nWordsD,pRes + 0x1fff,pD + (long)(int)pC0 + 0x1fff,pD + 0x1fff,(int)pC0);
  }
  iVar1 = Abc_TtEqual(pInit,(word *)&nWordsD,(int)pC0);
  if (iVar1 == 0) {
    printf("      Verification failed");
  }
  printf("\n");
  return 1;
}

Assistant:

int Dau_DecVerify( word * pInit, int nVars, char * pDsdC, char * pDsdD )
{
    word pC[1<<13], pD[1<<13], pRes[1<<13]; // max = 16
    int nWordsC = Abc_TtWordNum(nVars+1);
    int nWordsD = Abc_TtWordNum(nVars);
    assert( nVars < 16 );
    memcpy( pC, Dau_DsdToTruth(pDsdC, nVars+1), sizeof(word) * nWordsC );
    memcpy( pD, Dau_DsdToTruth(pDsdD, nVars), sizeof(word) * nWordsD );
    if ( nVars >= 6 )
    {
        assert( nWordsD >= 1 );
        assert( nWordsC > 1 );
        Abc_TtMux( pRes, pD, pC + nWordsD, pC, nWordsD );
    }
    else
    {
        word pC0 = Abc_Tt6Stretch( pC[0], nVars );
        word pC1 = Abc_Tt6Stretch( (pC[0] >> (1 << nVars)), nVars );
        Abc_TtMux( pRes, pD, &pC1, &pC0, nWordsD );
    }
    if ( !Abc_TtEqual(pInit, pRes, nWordsD) )
        printf( "      Verification failed" );
//    else
//        printf( "      Verification successful" );
    printf( "\n" );
    return 1;
}